

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
::reserve(InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  int i;
  ulong uVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar8;
  
  if (this->ptr ==
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
       *)0x0) {
    uVar7 = 0x10;
  }
  else {
    uVar7 = this->nAlloc;
  }
  if (uVar7 < n) {
    pmVar3 = (this->alloc).memoryResource;
    iVar5 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n << 4,8);
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < this->nStored; uVar7 = uVar7 + 1) {
      ppVar8 = this->ptr;
      if (this->ptr ==
          (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           *)0x0) {
        ppVar8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)&this->field_2;
      }
      puVar1 = (undefined8 *)((long)&ppVar8->first + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                         *)CONCAT44(extraout_var,iVar5))->first + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
    }
    pmVar3 = (this->alloc).memoryResource;
    (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc << 4,8);
    this->nAlloc = n;
    this->ptr = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                 *)CONCAT44(extraout_var,iVar5);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }